

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

void __thiscall irr::core::string<char>::reallocate(string<char> *this,s32 new_size)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar1 = this->array;
  pcVar2 = (char *)operator_new__((long)new_size);
  this->array = pcVar2;
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  if (0 < new_size) {
    uVar3 = 0;
    do {
      this->array[uVar3] = pcVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)new_size != uVar3);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}